

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  xmlNodePtr cur;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlDocPtr doc;
  long lVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  _xmlNode **pp_Var10;
  char local_228 [504];
  
  logfile = (FILE *)fopen64("runxmlconf.log","wb");
  if ((FILE *)logfile == (FILE *)0x0) {
    fwrite("Could not open the log file, running in verbose mode\n",0x35,1,_stderr);
    verbose = 1;
  }
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffffffffffff,0);
  }
  iVar4 = nb_leaks;
  iVar3 = nb_tests;
  iVar2 = nb_errors;
  pcVar8 = "xmlconf";
  for (iVar5 = 1; iVar5 < argc; iVar5 = iVar5 + 1) {
    pcVar1 = argv[iVar5];
    if (*pcVar1 != '-') {
LAB_0010257a:
      fprintf(_stderr,"invalid argument: %s\n");
      return 1;
    }
    if ((pcVar1[1] == 'v') && (pcVar1[2] == '\0')) {
      verbose = 1;
    }
    else {
      if ((pcVar1[1] != 'd') || ((pcVar1[2] != '\0' || (iVar5 = iVar5 + 1, argc <= iVar5))))
      goto LAB_0010257a;
      pcVar8 = argv[iVar5];
    }
  }
  snprintf(local_228,500,"%s/xmlconf.xml",pcVar8);
  iVar5 = checkTestFile(local_228);
  if (iVar5 == 0) {
    pcVar8 = "%s is missing \n";
LAB_00102700:
    fprintf(_stderr,pcVar8,local_228);
    xmlconfInfo();
  }
  else {
    doc = (xmlDocPtr)xmlReadFile(local_228,0,2);
    if (doc == (xmlDocPtr)0x0) {
      pcVar8 = "%s is corrupted \n";
      goto LAB_00102700;
    }
    lVar6 = xmlDocGetRootElement(doc);
    if ((lVar6 == 0) || (iVar5 = xmlStrEqual(*(undefined8 *)(lVar6 + 0x10),"TESTSUITE"), iVar5 == 0)
       ) {
      fprintf(_stderr,"Unexpected format %s\n",local_228);
      xmlconfInfo();
    }
    else {
      lVar7 = xmlGetProp(lVar6,"PROFILE");
      if (lVar7 == 0) {
        puts("Test suite");
      }
      else {
        printf("Test suite: %s\n",lVar7);
        (*_xmlFree)(lVar7);
      }
      pp_Var10 = (_xmlNode **)(lVar6 + 0x18);
      while (cur = *pp_Var10, cur != (xmlNodePtr)0x0) {
        if (cur->type == XML_ELEMENT_NODE) {
          iVar5 = xmlStrEqual(cur->name,"TESTCASES");
          if (iVar5 == 0) {
            fprintf(_stderr,"Unhandled element %s\n",cur->name);
          }
          else {
            xmlconfTestCases(doc,cur,1);
          }
        }
        pp_Var10 = &cur->next;
      }
    }
    xmlFreeDoc(doc);
  }
  if (nb_leaks == iVar4 && nb_errors == iVar2) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
           (ulong)(uint)(nb_errors - iVar2),(ulong)(uint)(nb_leaks - iVar4));
  }
  uVar9 = (ulong)(uint)nb_tests;
  if (nb_errors == 0 && nb_leaks == 0) {
    pcVar8 = "Total %d tests, no errors\n";
  }
  else {
    printf("Total %d tests, %d errors, %d leaks\n",uVar9);
    printf("See %s for detailed output\n","runxmlconf.log");
    iVar5 = 1;
    if ((nb_leaks != 0) || (nb_errors != 0xf)) goto LAB_0010267e;
    pcVar8 = "%d errors were expected\n";
    uVar9 = 0xf;
  }
  iVar5 = 0;
  printf(pcVar8,uVar9);
LAB_0010267e:
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return iVar5;
}

Assistant:

int
main(int argc, char **argv) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;
    const char *dir = "xmlconf";
    int i;

    logfile = fopen(LOGFILE, "wb");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            verbose = 1;
        } else if (strcmp(argv[i], "-d") == 0 && i + 1 < argc) {
            i += 1;
            dir = argv[i];
        } else {
            fprintf(stderr, "invalid argument: %s\n", argv[i]);
            return 1;
        }
    }

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xmlconfTest(dir);
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
	ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
	printf("See %s for detailed output\n", LOGFILE);
	if ((nb_leaks == 0) && (nb_errors == NB_EXPECTED_ERRORS)) {
	    printf("%d errors were expected\n", nb_errors);
	    ret = 0;
	}
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}